

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O3

RecyclableObject * __thiscall Js::JavascriptProxy::GetTarget(JavascriptProxy *this)

{
  bool bVar1;
  
  bVar1 = IsRevoked(this);
  if (!bVar1) {
    return (this->target).ptr;
  }
  JavascriptError::ThrowTypeError
            ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ea15,L"");
}

Assistant:

RecyclableObject* JavascriptProxy::GetTarget()
    {
        if (IsRevoked())
        {
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_ErrorOnRevokedProxy, _u(""));
        }
        return target;
    }